

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

pageant_pubkey * find_key(char *string,char **retstr)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint type;
  Filename *filename;
  pageant_pubkey *ppVar4;
  char *pcVar5;
  byte bVar6;
  undefined1 uVar7;
  pageant_pubkey key_in;
  key_find_ctx ctx [1];
  pageant_pubkey local_60;
  char *local_48;
  undefined1 local_40;
  undefined1 local_3f;
  byte local_3e;
  byte local_3d;
  pageant_pubkey *local_38;
  int local_30;
  
  iVar2 = strncmp(string,"file:",5);
  if (iVar2 == 0) {
    string = string + 5;
    uVar7 = 0;
LAB_0010ad15:
    filename = filename_from_str(string);
    type = key_type(filename);
    if (type < 0xb) {
      if ((0x608U >> (type & 0x1f) & 1) == 0) {
        if ((0x104U >> (type & 0x1f) & 1) == 0) goto LAB_0010ae98;
        local_60.blob = strbuf_new();
        iVar3 = rsa1_loadpub_f(filename,(local_60.blob)->binarysink_,(char **)0x0,&local_48);
        if (iVar3 == 0) goto LAB_0010ae4c;
        local_60.ssh_version = 1;
      }
      else {
        local_60.blob = strbuf_new();
        _Var1 = ppk_loadpub_f(filename,(char **)0x0,(local_60.blob)->binarysink_,(char **)0x0,
                              &local_48);
        if (!_Var1) {
LAB_0010ae4c:
          strbuf_free(local_60.blob);
          local_60.blob = (strbuf *)0x0;
          if (iVar2 != 0) goto LAB_0010aea0;
          pcVar5 = "unable to load file \'%s\': %s";
          goto LAB_0010af7b;
        }
        local_60.ssh_version = 2;
      }
      local_60.comment = (char *)0x0;
      ppVar4 = pageant_pubkey_copy(&local_60);
      strbuf_free(local_60.blob);
      local_60.blob = (strbuf *)0x0;
    }
    else {
LAB_0010ae98:
      if (iVar2 != 0) {
LAB_0010aea0:
        filename_free(filename);
        local_3d = 1;
        local_3e = 0;
        bVar6 = 1;
        local_3f = uVar7;
        goto LAB_0010aeb1;
      }
      local_48 = key_type_to_str(type);
      pcVar5 = "unable to load key file \'%s\': %s";
LAB_0010af7b:
      ppVar4 = (pageant_pubkey *)0x0;
      pcVar5 = dupprintf(pcVar5,string,local_48);
      *retstr = pcVar5;
    }
    filename_free(filename);
    return ppVar4;
  }
  iVar3 = strncmp(string,"comment:",8);
  if (iVar3 == 0) {
    string = string + 8;
    local_3d = 1;
    local_3e = 0;
    bVar6 = 1;
    local_3f = 1;
    uVar7 = 0;
    goto LAB_0010aeb1;
  }
  if (((*string == 'f') && (string[1] == 'p')) && (string[2] == ':')) {
    string = string + 3;
LAB_0010ae7e:
    local_3d = 1;
    local_3e = 0;
    bVar6 = 1;
  }
  else {
    iVar3 = strncmp(string,"fingerprint:",0xc);
    if (iVar3 == 0) {
      string = string + 0xc;
      goto LAB_0010ae7e;
    }
    iVar3 = strncasecmp(string,"md5:",4);
    if (iVar3 == 0) {
      string = string + 4;
      local_3e = 1;
      local_3d = 0;
    }
    else {
      iVar3 = strncmp(string,"sha256:",7);
      uVar7 = 1;
      if (iVar3 != 0) goto LAB_0010ad15;
      string = string + 7;
      local_3d = 1;
      local_3e = 0;
    }
    bVar6 = 0;
  }
  uVar7 = 1;
  local_3f = 0;
LAB_0010aeb1:
  local_3e = local_3e | bVar6;
  local_3d = local_3d | bVar6;
  local_38 = (pageant_pubkey *)0x0;
  local_30 = 0;
  local_48 = string;
  local_40 = uVar7;
  iVar2 = pageant_enum_keys(key_find_callback,&local_48,retstr);
  if (iVar2 != 1) {
    if (local_30 == 0) {
      pcVar5 = dupstr("no key matched");
      *retstr = pcVar5;
      if (local_38 != (pageant_pubkey *)0x0) {
        __assert_fail("!ctx->found",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                      ,0x32b,"struct pageant_pubkey *find_key(const char *, char **)");
      }
    }
    else {
      if (local_30 < 2) {
        if (local_38 != (pageant_pubkey *)0x0) {
          return local_38;
        }
        __assert_fail("ctx->found",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                      ,0x334,"struct pageant_pubkey *find_key(const char *, char **)");
      }
      pcVar5 = dupstr("multiple keys matched");
      *retstr = pcVar5;
      if (local_38 == (pageant_pubkey *)0x0) {
        __assert_fail("ctx->found",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                      ,0x32f,"struct pageant_pubkey *find_key(const char *, char **)");
      }
      pageant_pubkey_free(local_38);
    }
  }
  return (pageant_pubkey *)0x0;
}

Assistant:

struct pageant_pubkey *find_key(const char *string, char **retstr)
{
    struct key_find_ctx ctx[1];
    struct pageant_pubkey key_in, *key_ret;
    bool try_file = true, try_fp = true, try_comment = true;
    bool file_errors = false;
    bool try_all_fptypes = true;
    FingerprintType fptype = SSH_FPTYPE_DEFAULT;

    /*
     * Trim off disambiguating prefixes telling us how to interpret
     * the provided string.
     */
    if (!strncmp(string, "file:", 5)) {
        string += 5;
        try_fp = false;
        try_comment = false;
        file_errors = true; /* also report failure to load the file */
    } else if (!strncmp(string, "comment:", 8)) {
        string += 8;
        try_file = false;
        try_fp = false;
    } else if (!strncmp(string, "fp:", 3)) {
        string += 3;
        try_file = false;
        try_comment = false;
    } else if (!strncmp(string, "fingerprint:", 12)) {
        string += 12;
        try_file = false;
        try_comment = false;
    } else if (!strnicmp(string, "md5:", 4)) {
        string += 4;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_MD5;
    } else if (!strncmp(string, "sha256:", 7)) {
        string += 7;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_SHA256;
    }

    /*
     * Try interpreting the string as a key file name.
     */
    if (try_file) {
        Filename *fn = filename_from_str(string);
        int keytype = key_type(fn);
        if (keytype == SSH_KEYTYPE_SSH1 ||
            keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!rsa1_loadpub_f(fn, BinarySink_UPCAST(key_in.blob),
                                NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 1;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else if (keytype == SSH_KEYTYPE_SSH2 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!ppk_loadpub_f(fn, NULL, BinarySink_UPCAST(key_in.blob),
                               NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 2;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else {
            if (file_errors) {
                *retstr = dupprintf("unable to load key file '%s': %s",
                                    string, key_type_to_str(keytype));
                filename_free(fn);
                return NULL;
            }
        }
        filename_free(fn);
    }

    /*
     * Failing that, go through the keys in the agent, and match
     * against fingerprints and comments as appropriate.
     */
    ctx->string = string;
    ctx->match_fp = try_fp;
    ctx->match_comment = try_comment;
    for (unsigned i = 0; i < SSH_N_FPTYPES; i++)
        ctx->match_fptypes[i] = (try_all_fptypes || i == fptype);
    ctx->found = NULL;
    ctx->nfound = 0;
    if (pageant_enum_keys(key_find_callback, ctx, retstr) ==
        PAGEANT_ACTION_FAILURE)
        return NULL;

    if (ctx->nfound == 0) {
        *retstr = dupstr("no key matched");
        assert(!ctx->found);
        return NULL;
    } else if (ctx->nfound > 1) {
        *retstr = dupstr("multiple keys matched");
        assert(ctx->found);
        pageant_pubkey_free(ctx->found);
        return NULL;
    }

    assert(ctx->found);
    return ctx->found;
}